

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O0

uchar * __thiscall asl::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  uchar *puVar1;
  SHA1 *this_local;
  
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  this->state[4] = 0xc3d2e1f0;
  this->count[1] = 0;
  this->count[0] = 0;
  puVar1 = (uchar *)memset(this->buffer,0,0x40);
  return puVar1;
}

Assistant:

SHA1::SHA1()
{
	state[0] = 0x67452301;
	state[1] = 0xEFCDAB89;
	state[2] = 0x98BADCFE;
	state[3] = 0x10325476;
	state[4] = 0xC3D2E1F0;
	count[0] = count[1] = 0;
	memset(buffer, 0, sizeof(buffer));
}